

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

basic_ostream<char,_std::char_traits<char>_> *
mjs::operator<<(basic_ostream<char,_std::char_traits<char>_> *os,source_extend *extend)

{
  element_type *peVar1;
  pointer pwVar2;
  ostream *poVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  pair<mjs::source_position,_mjs::source_position> local_40;
  wstring_view local_30;
  undefined1 local_20 [16];
  
  peVar1 = (extend->file).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_30._M_str = (peVar1->text_)._M_dataplus._M_p;
  local_30._M_len = (peVar1->text_)._M_string_length;
  local_40 = extend_to_positions(&local_30,extend->start,extend->end);
  peVar1 = (extend->file).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pwVar2 = (peVar1->filename_)._M_dataplus._M_p;
  local_30._M_len = (size_t)local_20;
  std::__cxx11::string::_M_construct<wchar_t_const*>
            ((string *)&local_30,pwVar2,pwVar2 + (peVar1->filename_)._M_string_length);
  std::operator<<(os,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  poVar3 = std::operator<<(os,":");
  pbVar4 = operator<<(poVar3,&local_40.first);
  poVar3 = std::operator<<(pbVar4,"-");
  pbVar4 = operator<<(poVar3,&local_40.second);
  return pbVar4;
}

Assistant:

std::basic_ostream<CharT>& operator<<(std::basic_ostream<CharT>& os, const source_extend& extend) {
        auto [start_pos, end_pos] = extend_to_positions(extend.file->text(), extend.start, extend.end);
        if constexpr (sizeof(CharT) == 1) {
            const auto fn = extend.file->filename();
            os << std::string(fn.begin(), fn.end());
        } else {
            os << extend.file->filename();
        }
        return os << ":" << start_pos << "-" << end_pos;
    }